

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O0

void __thiscall
Diligent::VulkanDynamicMemoryManager::VulkanDynamicMemoryManager
          (VulkanDynamicMemoryManager *this,IMemoryAllocator *Allocator,RenderDeviceVkImpl *DeviceVk
          ,Uint32 Size,Uint64 CommandQueueMask)

{
  undefined *puVar1;
  uint32_t uVar2;
  VulkanPhysicalDevice *pVVar3;
  VkDeviceSize VVar4;
  Char *pCVar5;
  VulkanLogicalDevice *this_00;
  VkBuffer_T *pVVar6;
  VkDeviceMemory_T *pVVar7;
  undefined8 uVar8;
  char (*in_stack_fffffffffffffd78) [2];
  MemorySizeFormatter<unsigned_int> local_190;
  undefined1 local_180 [8];
  string _msg;
  char *local_158;
  VkResult local_14c;
  Uint8 *pUStack_148;
  VkResult err;
  void *Data;
  undefined1 local_128 [8];
  string msg_1;
  VkMemoryAllocateInfo MemAlloc;
  VulkanPhysicalDevice *PhysicalDevice;
  VkMemoryRequirements MemReqs;
  VulkanLogicalDevice *LogicalDevice;
  VkBufferCreateInfo VkBuffCI;
  char local_64 [4];
  undefined1 local_60 [8];
  string msg;
  Uint64 CommandQueueMask_local;
  RenderDeviceVkImpl *pRStack_20;
  Uint32 Size_local;
  RenderDeviceVkImpl *DeviceVk_local;
  IMemoryAllocator *Allocator_local;
  VulkanDynamicMemoryManager *this_local;
  
  CommandQueueMask_local._4_4_ = Size;
  pRStack_20 = DeviceVk;
  DeviceVk_local = (RenderDeviceVkImpl *)Allocator;
  Allocator_local = (IMemoryAllocator *)this;
  DynamicHeap::MasterBlockListBasedManager::MasterBlockListBasedManager
            (&this->super_MasterBlockListBasedManager,Allocator,Size);
  this->m_DeviceVk = pRStack_20;
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_VkBuffer);
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  VulkanObjectWrapper(&this->m_BufferMemory);
  pVVar3 = RenderDeviceVkImpl::GetPhysicalDevice(pRStack_20);
  VVar4 = GetDefaultAlignment(pVVar3);
  this->m_DefaultAlignment = VVar4;
  this->m_CommandQueueMask = CommandQueueMask;
  this->m_TotalPeakSize = 0;
  if ((CommandQueueMask_local._4_4_ & 0x3ff) != 0) {
    local_64[0] = '\0';
    local_64[1] = '\x04';
    local_64[2] = '\0';
    local_64[3] = '\0';
    FormatString<char[12],unsigned_int,char[48],unsigned_int,char[2]>
              ((string *)local_60,(Diligent *)"Heap size (",
               (char (*) [12])((long)&CommandQueueMask_local + 4),
               (uint *)" is not aligned by the master block alignment (",(char (*) [48])local_64,
               (uint *)0xcabce5,in_stack_fffffffffffffd78);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x3a);
    std::__cxx11::string::~string((string *)local_60);
  }
  LogicalDevice = (VulkanLogicalDevice *)0xc;
  VkBuffCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  VkBuffCI._4_4_ = 0;
  VkBuffCI.pNext = (void *)0x0;
  VkBuffCI._16_8_ = ZEXT48(CommandQueueMask_local._4_4_);
  VkBuffCI.size = 0x1f1;
  VkBuffCI.usage = 0;
  VkBuffCI.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  VkBuffCI.queueFamilyIndexCount = 0;
  VkBuffCI._44_4_ = 0;
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRStack_20);
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&MemReqs.memoryTypeBits,this_00,(VkBufferCreateInfo *)&LogicalDevice,
             "Dynamic heap buffer");
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_VkBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
            &MemReqs.memoryTypeBits);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &MemReqs.memoryTypeBits);
  pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_VkBuffer);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)&PhysicalDevice,this_00,pVVar6);
  pVVar3 = RenderDeviceVkImpl::GetPhysicalDevice(pRStack_20);
  msg_1.field_2._8_8_ = 5;
  uVar2 = VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                    (pVVar3,(uint32_t)MemReqs.alignment,6);
  if (uVar2 == 0xffffffff) {
    FormatString<char[340]>
              ((string *)local_128,
               (char (*) [340])
               "Vulkan spec requires that for a VkBuffer not created with the VK_BUFFER_CREATE_SPARSE_BINDING_BIT bit set, the memoryTypeBits member always contains at least one bit set corresponding to a VkMemoryType with a propertyFlags that has both the VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT bit and the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit set(11.6)"
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x60);
    std::__cxx11::string::~string((string *)local_128);
  }
  VulkanUtilities::VulkanLogicalDevice::AllocateDeviceMemory
            ((DeviceMemoryWrapper *)&Data,this_00,(VkMemoryAllocateInfo *)((long)&msg_1.field_2 + 8)
             ,"Host-visible memory for upload buffer");
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  operator=(&this->m_BufferMemory,
            (VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *)&Data
           );
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *)
             &Data);
  pUStack_148 = (Uint8 *)0x0;
  pVVar7 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDeviceMemory_T_
                     ((VulkanObjectWrapper *)&this->m_BufferMemory);
  local_14c = VulkanUtilities::VulkanLogicalDevice::MapMemory
                        (this_00,pVVar7,0,(VkDeviceSize)PhysicalDevice,0,&stack0xfffffffffffffeb8);
  this->m_CPUAddress = pUStack_148;
  if (local_14c != VK_SUCCESS) {
    local_158 = VulkanUtilities::VkResultToString(local_14c);
    LogError<true,char[22],char[17],char_const*>
              (false,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x6d,(char (*) [22])"Failed to map  memory",(char (*) [17])"\nVK Error Code: ",
               &local_158);
  }
  pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_VkBuffer);
  pVVar7 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDeviceMemory_T_
                     ((VulkanObjectWrapper *)&this->m_BufferMemory);
  local_14c = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory(this_00,pVVar6,pVVar7,0);
  if (local_14c != VK_SUCCESS) {
    _msg.field_2._8_8_ = VulkanUtilities::VkResultToString(local_14c);
    LogError<true,char[29],char[17],char_const*>
              (false,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x70,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)((long)&_msg.field_2 + 8));
  }
  local_190 = FormatMemorySize<unsigned_int>(CommandQueueMask_local._4_4_,2,0);
  FormatString<char[46],Diligent::MemorySizeFormatter<unsigned_int>>
            ((string *)local_180,(Diligent *)"GPU dynamic heap created. Total buffer size: ",
             (char (*) [46])&local_190,local_190._0_8_);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar8 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar8,0);
  }
  std::__cxx11::string::~string((string *)local_180);
  return;
}

Assistant:

VulkanDynamicMemoryManager::VulkanDynamicMemoryManager(IMemoryAllocator&   Allocator,
                                                       RenderDeviceVkImpl& DeviceVk,
                                                       Uint32              Size,
                                                       Uint64              CommandQueueMask) :
    // clang-format off
    TBase             {Allocator, Size},
    m_DeviceVk        {DeviceVk},
    m_DefaultAlignment{GetDefaultAlignment(DeviceVk.GetPhysicalDevice())},
    m_CommandQueueMask{CommandQueueMask}
// clang-format on
{
    VERIFY((Size & (MasterBlockAlignment - 1)) == 0, "Heap size (", Size, " is not aligned by the master block alignment (", Uint32{MasterBlockAlignment}, ")");

    VkBufferCreateInfo VkBuffCI{};
    VkBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkBuffCI.pNext = nullptr;
    VkBuffCI.flags = 0; // VK_BUFFER_CREATE_SPARSE_BINDING_BIT, VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT, VK_BUFFER_CREATE_SPARSE_ALIASED_BIT
    VkBuffCI.size  = Size;
    VkBuffCI.usage =
        VK_BUFFER_USAGE_TRANSFER_SRC_BIT |
        VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT |
        VK_BUFFER_USAGE_STORAGE_BUFFER_BIT |
        VK_BUFFER_USAGE_INDEX_BUFFER_BIT |
        VK_BUFFER_USAGE_VERTEX_BUFFER_BIT |
        VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT;
    VkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    VkBuffCI.queueFamilyIndexCount = 0;
    VkBuffCI.pQueueFamilyIndices   = nullptr;

    const auto& LogicalDevice    = DeviceVk.GetLogicalDevice();
    m_VkBuffer                   = LogicalDevice.CreateBuffer(VkBuffCI, "Dynamic heap buffer");
    VkMemoryRequirements MemReqs = LogicalDevice.GetBufferMemoryRequirements(m_VkBuffer);

    const auto& PhysicalDevice = DeviceVk.GetPhysicalDevice();

    VkMemoryAllocateInfo MemAlloc{};
    MemAlloc.pNext          = nullptr;
    MemAlloc.sType          = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    MemAlloc.allocationSize = MemReqs.size;

    // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
    // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
    // to the host (10.2)
    MemAlloc.memoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);

    VERIFY(MemAlloc.memoryTypeIndex != VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex,
           "Vulkan spec requires that for a VkBuffer not created with the "
           "VK_BUFFER_CREATE_SPARSE_BINDING_BIT bit set, the memoryTypeBits member always contains at least one bit set "
           "corresponding to a VkMemoryType with a propertyFlags that has both the VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT bit "
           "and the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit set(11.6)");

    m_BufferMemory = LogicalDevice.AllocateDeviceMemory(MemAlloc, "Host-visible memory for upload buffer");

    void* Data = nullptr;

    auto err = LogicalDevice.MapMemory(
        m_BufferMemory,
        0, // offset
        MemAlloc.allocationSize,
        0, // flags, reserved for future use
        &Data);
    m_CPUAddress = reinterpret_cast<Uint8*>(Data);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to map  memory");

    err = LogicalDevice.BindBufferMemory(m_VkBuffer, m_BufferMemory, 0 /*offset*/);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    LOG_INFO_MESSAGE("GPU dynamic heap created. Total buffer size: ", FormatMemorySize(Size, 2));
}